

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3UpdateDocTotals(int *pRC,Fts3Table *p,u32 *aSzIns,u32 *aSzDel,int nChng)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  sqlite3_stmt *psVar4;
  void *pvVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  uint *__s;
  Mem *pVal;
  long lVar9;
  byte *pbVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  sqlite3_stmt *pStmt;
  int local_78;
  sqlite3_stmt *local_68;
  int local_60;
  int local_5c;
  long local_58;
  int *local_50;
  void *local_48;
  ulong local_40;
  uint local_38 [2];
  
  if (*pRC == 0) {
    local_58 = (long)p->nColumn;
    uVar1 = local_58 + 2;
    local_5c = nChng;
    iVar7 = sqlite3_initialize();
    if (iVar7 == 0) {
      __s = (uint *)sqlite3Malloc(uVar1 * 0xe);
    }
    else {
      __s = (uint *)0x0;
    }
    if (__s == (uint *)0x0) {
      *pRC = 7;
    }
    else {
      iVar7 = fts3SqlStmt(p,0x16,&local_68,(sqlite3_value **)0x0);
      psVar4 = local_68;
      if (iVar7 == 0) {
        uVar12 = 0;
        sqlite3_bind_int64(local_68,1,0);
        iVar7 = sqlite3_step(psVar4);
        if (iVar7 == 100) {
          pVal = columnMem(psVar4,0);
          local_48 = sqlite3_value_blob(pVal);
          columnMallocFailure(psVar4);
          iVar7 = sqlite3_column_bytes(psVar4,0);
          pvVar5 = local_48;
          if (((iVar7 != 0) && (-1 < *(char *)((long)local_48 + (long)iVar7 + -1))) &&
             (0 < iVar7 && -2 < (int)local_58)) {
            local_40 = uVar1 & 0xffffffff;
            uVar12 = 0;
            iVar11 = 0;
            local_60 = iVar7;
            local_50 = pRC;
            do {
              iVar7 = sqlite3Fts3GetVarint
                                ((char *)((long)iVar11 + (long)pvVar5),(sqlite_int64 *)local_38);
              __s[uVar12] = local_38[0];
              uVar12 = uVar12 + 1;
              pRC = local_50;
              if (local_40 <= uVar12) break;
              iVar11 = iVar11 + iVar7;
            } while (iVar11 < local_60);
          }
          local_78 = (int)uVar1;
          if ((int)(uint)uVar12 < local_78) {
            memset(__s + (uVar12 & 0xffffffff),0,(ulong)(~(uint)uVar12 + local_78) * 4 + 4);
          }
        }
        else {
          memset(__s,0,uVar1 * 4);
        }
        iVar7 = sqlite3_reset(psVar4);
        if (iVar7 == 0) {
          if ((-1 < local_5c) || (uVar8 = 0, (uint)-local_5c <= *__s)) {
            uVar8 = local_5c + *__s;
          }
          *__s = uVar8;
          if (-1 < p->nColumn) {
            lVar9 = -1;
            do {
              uVar8 = (aSzIns[lVar9 + 1] + __s[lVar9 + 2]) - aSzDel[lVar9 + 1];
              if (aSzIns[lVar9 + 1] + __s[lVar9 + 2] < aSzDel[lVar9 + 1]) {
                uVar8 = 0;
              }
              __s[lVar9 + 2] = uVar8;
              lVar9 = lVar9 + 1;
            } while (lVar9 < p->nColumn);
          }
          iVar7 = 0;
          if (-2 < (int)local_58) {
            uVar12 = 0;
            iVar7 = 0;
            do {
              pbVar6 = (byte *)((long)iVar7 + (long)(__s + uVar1));
              uVar13 = (ulong)__s[uVar12];
              do {
                pbVar10 = pbVar6;
                bVar3 = (byte)uVar13;
                *pbVar10 = bVar3 | 0x80;
                iVar7 = iVar7 + 1;
                bVar2 = 0x7f < uVar13;
                pbVar6 = pbVar10 + 1;
                uVar13 = uVar13 >> 7;
              } while (bVar2);
              *pbVar10 = bVar3;
              uVar12 = uVar12 + 1;
            } while (uVar12 != (uVar1 & 0xffffffff));
          }
          iVar11 = fts3SqlStmt(p,0x17,&local_68,(sqlite3_value **)0x0);
          psVar4 = local_68;
          if (iVar11 != 0) {
            sqlite3_free(__s);
            *pRC = iVar11;
            return;
          }
          sqlite3_bind_int64(local_68,1,0);
          bindText(psVar4,2,__s + uVar1,iVar7,(_func_void_void_ptr *)0x0,'\0');
          sqlite3_step(local_68);
          iVar7 = sqlite3_reset(local_68);
          *pRC = iVar7;
          sqlite3_bind_null(local_68,2);
          sqlite3_free(__s);
          return;
        }
      }
      sqlite3_free(__s);
      *pRC = iVar7;
    }
  }
  return;
}

Assistant:

static void fts3UpdateDocTotals(
  int *pRC,                       /* The result code */
  Fts3Table *p,                   /* Table being updated */
  u32 *aSzIns,                    /* Size increases */
  u32 *aSzDel,                    /* Size decreases */
  int nChng                       /* Change in the number of documents */
){
  char *pBlob;             /* Storage for BLOB written into %_stat */
  int nBlob;               /* Size of BLOB written into %_stat */
  u32 *a;                  /* Array of integers that becomes the BLOB */
  sqlite3_stmt *pStmt;     /* Statement for reading and writing */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subfunctions */

  const int nStat = p->nColumn+2;

  if( *pRC ) return;
  a = sqlite3_malloc64( (sizeof(u32)+10)*(sqlite3_int64)nStat );
  if( a==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  pBlob = (char*)&a[nStat];
  rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  if( sqlite3_step(pStmt)==SQLITE_ROW ){
    fts3DecodeIntArray(nStat, a,
         sqlite3_column_blob(pStmt, 0),
         sqlite3_column_bytes(pStmt, 0));
  }else{
    memset(a, 0, sizeof(u32)*(nStat) );
  }
  rc = sqlite3_reset(pStmt);
  if( rc!=SQLITE_OK ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  if( nChng<0 && a[0]<(u32)(-nChng) ){
    a[0] = 0;
  }else{
    a[0] += nChng;
  }
  for(i=0; i<p->nColumn+1; i++){
    u32 x = a[i+1];
    if( x+aSzIns[i] < aSzDel[i] ){
      x = 0;
    }else{
      x = x + aSzIns[i] - aSzDel[i];
    }
    a[i+1] = x;
  }
  fts3EncodeIntArray(nStat, a, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, SQLITE_STATIC);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
  sqlite3_bind_null(pStmt, 2);
  sqlite3_free(a);
}